

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_key.c
# Opt level: O0

int ossl_dh_generate_public_key(BN_CTX *ctx,DH *dh,BIGNUM *priv_key,BIGNUM *pub_key)

{
  int iVar1;
  BIGNUM *dest;
  undefined8 in_RCX;
  BIGNUM *in_RDX;
  long in_RSI;
  BN_CTX *in_RDI;
  BN_MONT_CTX **pmont;
  BN_MONT_CTX *mont;
  BIGNUM *prk;
  int ret;
  undefined8 local_40;
  undefined4 local_2c;
  undefined4 local_4;
  
  local_2c = 0;
  dest = BN_new();
  local_40 = (BN_MONT_CTX *)0x0;
  if (dest == (BIGNUM *)0x0) {
    local_4 = 0;
  }
  else {
    if (((*(uint *)(in_RSI + 0x78) & 1) == 0) ||
       (local_40 = BN_MONT_CTX_set_locked
                             ((BN_MONT_CTX **)(in_RSI + 0x80),(int)*(undefined8 *)(in_RSI + 0xb8),
                              *(BIGNUM **)(in_RSI + 8),in_RDI), local_40 != (BN_MONT_CTX *)0x0)) {
      BN_with_flags((BIGNUM *)dest,in_RDX,4);
      iVar1 = (**(code **)(*(long *)(in_RSI + 0xb0) + 0x18))
                        (in_RSI,in_RCX,*(undefined8 *)(in_RSI + 0x18),dest,
                         *(undefined8 *)(in_RSI + 8),in_RDI,local_40);
      if (iVar1 != 0) {
        local_2c = 1;
      }
    }
    BN_clear_free(dest);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int ossl_dh_generate_public_key(BN_CTX *ctx, const DH *dh,
                                const BIGNUM *priv_key, BIGNUM *pub_key)
{
    int ret = 0;
    BIGNUM *prk = BN_new();
    BN_MONT_CTX *mont = NULL;

    if (prk == NULL)
        return 0;

    if (dh->flags & DH_FLAG_CACHE_MONT_P) {
        /*
         * We take the input DH as const, but we lie, because in some cases we
         * want to get a hold of its Montgomery context.
         *
         * We cast to remove the const qualifier in this case, it should be
         * fine...
         */
        BN_MONT_CTX **pmont = (BN_MONT_CTX **)&dh->method_mont_p;

        mont = BN_MONT_CTX_set_locked(pmont, dh->lock, dh->params.p, ctx);
        if (mont == NULL)
            goto err;
    }
    BN_with_flags(prk, priv_key, BN_FLG_CONSTTIME);

    /* pub_key = g^priv_key mod p */
    if (!dh->meth->bn_mod_exp(dh, pub_key, dh->params.g, prk, dh->params.p,
                              ctx, mont))
        goto err;
    ret = 1;
err:
    BN_clear_free(prk);
    return ret;
}